

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * __thiscall Kvm::letToFuncApp(Kvm *this,Value *v)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value *pVVar4;
  Value *result2;
  Value *local_38;
  Value *local_30;
  
  local_38 = (Value *)0x0;
  local_30 = (Value *)0x0;
  this_00 = &this->gc_;
  Kgc::pushLocalStackRoot(this_00,&local_38);
  Kgc::pushLocalStackRoot(this_00,&local_30);
  local_38 = bindingsParameters(this,*(Value **)(*(long *)&v[1].type_ + 0x18));
  local_38 = makeLambda(this,local_38,*(Value **)(*(long *)&v[1].type_ + 0x20));
  pVVar3 = bindingsArguments(this,*(Value **)(*(long *)&v[1].type_ + 0x18));
  pVVar2 = local_38;
  local_30 = pVVar3;
  pVVar4 = Kgc::allocValue(this_00,CELL);
  pVVar4[1]._vptr_Value = (_func_int **)pVVar2;
  *(Value **)&pVVar4[1].type_ = pVVar3;
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -2;
  return pVVar4;
}

Assistant:

const Value* Kvm::letToFuncApp(const Value *v)
{
    const Value *result1 = nullptr;
    const Value *result2 = nullptr;
    
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result1);
    guard.pushLocalStackRoot(&result2);
    result1 = letParameters(v);
    result1 = makeLambda(result1, letBody(v));
    result2 = letArguments(v);
    result1 = makeFuncApplication(result1, result2);
    return result1;
}